

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ConstraintBlockSyntax * __thiscall
slang::parsing::Parser::parseConstraintBlock(Parser *this,bool isTopLevel)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  Diagnostic *this_00;
  SourceLocation SVar3;
  undefined8 uVar4;
  ConstraintBlockSyntax *pCVar5;
  BumpAllocator *dst;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  Token TVar9;
  SourceRange range;
  string_view arg;
  Token openBrace;
  ConstraintItemSyntax *member;
  Token closeBrace;
  Token local_b8;
  Info *local_a8;
  undefined8 local_a0;
  Token *local_98;
  Token *local_90;
  SmallVector<slang::syntax::ConstraintItemSyntax_*,_8UL> members;
  undefined4 extraout_var;
  
  Token::Token(&closeBrace);
  TVar9 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.cap = 8;
  local_90 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_98 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar6 = false;
  while( true ) {
    local_a8 = TVar9.info;
    local_a0 = TVar9._0_8_;
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar9.kind == EndOfFile) || ((TVar9._0_4_ & 0xffff) == 0xe)) break;
    member = parseConstraintItem(this,false,isTopLevel);
    bVar8 = member == (ConstraintItemSyntax *)0x0;
    if (bVar8) {
      bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar9.kind);
      if (bVar2) {
        local_b8 = ParserBase::peek(&this->super_ParserBase);
        range = Token::range(&local_b8);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_b8 = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText(&local_b8);
        Diagnostic::operator<<(this_00,arg);
        bVar7 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar7 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar3 = Token::location(local_90);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar3);
          SVar3 = Token::location(local_98);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar3);
          bVar7 = 0;
        }
      }
      else {
        bVar7 = ~bVar6 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar7 << 0x20 | 0x450005));
    }
    else {
      SmallVectorBase<slang::syntax::ConstraintItemSyntax*>::
      emplace_back<slang::syntax::ConstraintItemSyntax*const&>
                ((SmallVectorBase<slang::syntax::ConstraintItemSyntax*> *)&members,&member);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (member->super_SyntaxNode).previewNode = pSVar1;
    }
    TVar9.info = local_a8;
    TVar9.kind = (undefined2)local_a0;
    TVar9._2_1_ = local_a0._2_1_;
    TVar9.numFlags.raw = local_a0._3_1_;
    TVar9.rawLen = local_a0._4_4_;
    bVar6 = bVar8;
  }
  closeBrace = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  dst = (this->super_ParserBase).alloc;
  uVar4._0_4_ = SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>::copy
                          (&members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>,
                           (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)closeBrace.info);
  uVar4._4_4_ = extraout_var;
  SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>::cleanup
            (&members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>,
             (EVP_PKEY_CTX *)dst);
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.len =
       CONCAT44(members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.len._4_4_,1);
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.cap = 0;
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement[0] = '\0';
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement[1] = '\0';
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement[2] = '\0';
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement[3] = '\0';
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement[4] = '\0';
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement[5] = '\0';
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement[6] = '\0';
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement[7] = '\0';
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.data_ =
       (pointer)&PTR_getChild_0057e420;
  openBrace.info = local_a8;
  openBrace.kind = (undefined2)local_a0;
  openBrace._2_1_ = local_a0._2_1_;
  openBrace.numFlags.raw = local_a0._3_1_;
  openBrace.rawLen = local_a0._4_4_;
  members.stackBase._8_8_ = uVar4;
  pCVar5 = slang::syntax::SyntaxFactory::constraintBlock
                     (&this->factory,openBrace,
                      (SyntaxList<slang::syntax::ConstraintItemSyntax> *)&members,closeBrace);
  return pCVar5;
}

Assistant:

ConstraintBlockSyntax& Parser::parseConstraintBlock(bool isTopLevel) {
    Token closeBrace;
    auto openBrace = expect(TokenKind::OpenBrace);
    auto members = parseMemberList<ConstraintItemSyntax>(
        TokenKind::CloseBrace, closeBrace, SyntaxKind::ConstraintBlock,
        [this, isTopLevel](SyntaxKind, bool&) { return parseConstraintItem(false, isTopLevel); });

    return factory.constraintBlock(openBrace, members, closeBrace);
}